

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageLogSink.h
# Opt level: O0

void __thiscall MessageLogSink<std::mutex>::MessageLogSink(MessageLogSink<std::mutex> *this)

{
  reference pvVar1;
  base_sink<std::mutex> *in_RDI;
  base_sink<std::mutex> *__n;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *this_00;
  __pthread_internal_list *this_01;
  Style local_68;
  pair<sf::Color,_unsigned_int> local_64;
  Style local_5c;
  pair<sf::Color,_unsigned_int> local_58;
  Style local_50;
  pair<sf::Color,_unsigned_int> local_4c;
  Style local_44;
  pair<sf::Color,_unsigned_int> local_40;
  Style local_38;
  pair<sf::Color,_unsigned_int> local_34;
  Style local_2c;
  pair<sf::Color,_unsigned_int> local_28;
  Style local_20;
  pair<sf::Color,_unsigned_int> local_1c [3];
  
  spdlog::sinks::base_sink<std::mutex>::base_sink(in_RDI);
  (in_RDI->super_sink)._vptr_sink = (_func_int **)&PTR__MessageLogSink_0047d1d0;
  __n = in_RDI + 1;
  this_01 = (__pthread_internal_list *)0x0;
  in_RDI[1].super_sink._vptr_sink = (_func_int **)0x0;
  *(undefined8 *)&in_RDI[1].super_sink.level_ = 0;
  std::weak_ptr<gui::ChatBox>::weak_ptr((weak_ptr<gui::ChatBox> *)0x15885c);
  this_00 = &in_RDI[1].formatter_;
  in_RDI[1].formatter_._M_t.
  super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
  super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
  super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl = (formatter *)0x0;
  in_RDI[1].mutex_.super___mutex_base._M_mutex.__align = (long)this_01;
  *(undefined8 *)((long)&in_RDI[1].mutex_.super___mutex_base._M_mutex + 8) = 0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>
            *)0x158883);
  *(undefined8 *)&in_RDI[2].super_sink.level_ = 0;
  in_RDI[2].formatter_._M_t.
  super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
  super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
  super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl = (formatter *)this_01;
  in_RDI[1].mutex_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0
  ;
  in_RDI[2].super_sink._vptr_sink = (_func_int **)this_01;
  *(undefined8 *)((long)&in_RDI[1].mutex_.super___mutex_base._M_mutex + 0x10) = 0;
  in_RDI[1].mutex_.super___mutex_base._M_mutex.__data.__list.__prev = this_01;
  in_RDI[2].mutex_.super___mutex_base._M_mutex.__align = 0;
  std::array<std::pair<sf::Color,_unsigned_int>,_7UL>::array
            ((array<std::pair<sf::Color,_unsigned_int>,_7UL> *)this_01);
  local_20 = Regular;
  std::pair<sf::Color,_unsigned_int>::pair<sf::Text::Style,_true>
            (local_1c,(Color *)&sf::Color::White,&local_20);
  pvVar1 = std::array<std::pair<sf::Color,_unsigned_int>,_7UL>::operator[]
                     ((array<std::pair<sf::Color,_unsigned_int>,_7UL> *)this_00,(size_type)__n);
  std::pair<sf::Color,_unsigned_int>::operator=(pvVar1,local_1c);
  local_2c = Regular;
  std::pair<sf::Color,_unsigned_int>::pair<sf::Text::Style,_true>
            (&local_28,(Color *)&sf::Color::Cyan,&local_2c);
  pvVar1 = std::array<std::pair<sf::Color,_unsigned_int>,_7UL>::operator[]
                     ((array<std::pair<sf::Color,_unsigned_int>,_7UL> *)this_00,(size_type)__n);
  std::pair<sf::Color,_unsigned_int>::operator=(pvVar1,&local_28);
  local_38 = Regular;
  std::pair<sf::Color,_unsigned_int>::pair<sf::Text::Style,_true>
            (&local_34,(Color *)&sf::Color::Green,&local_38);
  pvVar1 = std::array<std::pair<sf::Color,_unsigned_int>,_7UL>::operator[]
                     ((array<std::pair<sf::Color,_unsigned_int>,_7UL> *)this_00,(size_type)__n);
  std::pair<sf::Color,_unsigned_int>::operator=(pvVar1,&local_34);
  local_44 = Regular;
  std::pair<sf::Color,_unsigned_int>::pair<sf::Text::Style,_true>
            (&local_40,(Color *)&sf::Color::Yellow,&local_44);
  pvVar1 = std::array<std::pair<sf::Color,_unsigned_int>,_7UL>::operator[]
                     ((array<std::pair<sf::Color,_unsigned_int>,_7UL> *)this_00,(size_type)__n);
  std::pair<sf::Color,_unsigned_int>::operator=(pvVar1,&local_40);
  local_50 = Regular;
  std::pair<sf::Color,_unsigned_int>::pair<sf::Text::Style,_true>
            (&local_4c,(Color *)&sf::Color::Red,&local_50);
  pvVar1 = std::array<std::pair<sf::Color,_unsigned_int>,_7UL>::operator[]
                     ((array<std::pair<sf::Color,_unsigned_int>,_7UL> *)this_00,(size_type)__n);
  std::pair<sf::Color,_unsigned_int>::operator=(pvVar1,&local_4c);
  local_5c = Italic;
  std::pair<sf::Color,_unsigned_int>::pair<sf::Text::Style,_true>
            (&local_58,(Color *)&sf::Color::Red,&local_5c);
  pvVar1 = std::array<std::pair<sf::Color,_unsigned_int>,_7UL>::operator[]
                     ((array<std::pair<sf::Color,_unsigned_int>,_7UL> *)this_00,(size_type)__n);
  std::pair<sf::Color,_unsigned_int>::operator=(pvVar1,&local_58);
  local_68 = Regular;
  std::pair<sf::Color,_unsigned_int>::pair<sf::Text::Style,_true>
            (&local_64,(Color *)&sf::Color::White,&local_68);
  pvVar1 = std::array<std::pair<sf::Color,_unsigned_int>,_7UL>::operator[]
                     ((array<std::pair<sf::Color,_unsigned_int>,_7UL> *)this_00,(size_type)__n);
  std::pair<sf::Color,_unsigned_int>::operator=(pvVar1,&local_64);
  return;
}

Assistant:

MessageLogSink() :
        chatBox_(),
        bufferedMessages_(),
        styles_() {

        styles_[spdlog::level::trace] = {sf::Color::White, sf::Text::Regular};
        styles_[spdlog::level::debug] = {sf::Color::Cyan, sf::Text::Regular};
        styles_[spdlog::level::info] = {sf::Color::Green, sf::Text::Regular};
        styles_[spdlog::level::warn] = {sf::Color::Yellow, sf::Text::Regular};
        styles_[spdlog::level::err] = {sf::Color::Red, sf::Text::Regular};
        styles_[spdlog::level::critical] = {sf::Color::Red, sf::Text::Italic};
        styles_[spdlog::level::off] = {sf::Color::White, sf::Text::Regular};
    }